

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

SourceLocation *
google::protobuf::internal::CheckNotNull<google::protobuf::SourceLocation>
          (char *file,int line,char *name,SourceLocation *val)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (val == (SourceLocation *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
               ,0x2d5);
    other = LogMessage::operator<<(&local_50,name);
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  return val;
}

Assistant:

T* CheckNotNull(const char *file, int line, const char *name, T* val) {
  if (val == NULL) {
    GOOGLE_LOG(FATAL) << name;
  }
  return val;
}